

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 addFloatx80Sigs(floatx80 a,floatx80 b,flag zSign,float_status *status)

{
  undefined8 extraout_RDX;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 fVar1;
  floatx80 fVar2;
  int local_7c;
  uint64_t uStack_78;
  int32_t expDiff;
  uint64_t zSig1;
  uint64_t zSig0;
  uint64_t bSig;
  uint64_t aSig;
  int32_t local_50;
  int32_t zExp;
  int32_t bExp;
  int32_t aExp;
  float_status *status_local;
  uint64_t uStack_38;
  flag zSign_local;
  floatx80 b_local;
  floatx80 a_local;
  
  uStack_38 = b.low;
  b_local._8_8_ = a.low;
  a_01.high = a.high;
  b_local.low._0_2_ = b.high;
  a_00._10_6_ = 0;
  a_00.low = (long)a._0_10_;
  a_00.high = (short)(a._0_10_ >> 0x40);
  _bExp = status;
  status_local._7_1_ = zSign;
  bSig = extractFloatx80Frac(a_00);
  a_01.low = b_local._8_8_;
  a_01._10_6_ = 0;
  zExp = extractFloatx80Exp(a_01);
  a_02.high = (uint16_t)b_local.low;
  a_02.low = uStack_38;
  a_02._10_6_ = 0;
  zSig0 = extractFloatx80Frac(a_02);
  a_03.high = (uint16_t)b_local.low;
  a_03.low = uStack_38;
  a_03._10_6_ = 0;
  local_50 = extractFloatx80Exp(a_03);
  local_7c = zExp - local_50;
  if (local_7c < 1) {
    if (local_7c < 0) {
      if (local_50 == 0x7fff) {
        if ((zSig0 & 0x7fffffffffffffff) == 0) {
          fVar1 = packFloatx80(status_local._7_1_,0x7fff,0x8000000000000000);
          a_01.high = fVar1.high;
        }
        else {
          a_05.high = a_01.high;
          a_05.low = b_local._8_8_;
          b_01.high = (uint16_t)b_local.low;
          b_01.low = uStack_38;
          a_05._10_6_ = 0;
          b_01._10_6_ = 0;
          fVar1 = propagateFloatx80NaN_tricore(a_05,b_01,_bExp);
          a_01.high = fVar1.high;
        }
        goto LAB_012c67df;
      }
      if (zExp == 0) {
        local_7c = local_7c + 1;
      }
      shift64ExtraRightJamming(bSig,0,-local_7c,&bSig,&stack0xffffffffffffff88);
      aSig._4_4_ = local_50;
      goto LAB_012c6765;
    }
    if (zExp == 0x7fff) {
      if (((bSig | zSig0) & 0x7fffffffffffffff) == 0) {
        fVar1._8_8_ = extraout_RDX;
        fVar1.low = b_local._8_8_;
      }
      else {
        a_06.high = a_01.high;
        a_06.low = b_local._8_8_;
        b_02.high = (uint16_t)b_local.low;
        b_02.low = uStack_38;
        a_06._10_6_ = 0;
        b_02._10_6_ = 0;
        fVar1 = propagateFloatx80NaN_tricore(a_06,b_02,_bExp);
        a_01.high = fVar1.high;
      }
      goto LAB_012c67df;
    }
    uStack_78 = 0;
    zSig1 = bSig + zSig0;
    if (zExp != 0) {
      aSig._4_4_ = zExp;
      goto LAB_012c677c;
    }
    if (zSig1 == 0) {
      fVar1 = packFloatx80(status_local._7_1_,0,0);
      a_01.high = fVar1.high;
      goto LAB_012c67df;
    }
    normalizeFloatx80Subnormal_tricore(zSig1,(int32_t *)((long)&aSig + 4),&zSig1);
  }
  else {
    if (zExp == 0x7fff) {
      if ((bSig & 0x7fffffffffffffff) == 0) {
        fVar1._8_8_ = extraout_RDX;
        fVar1.low = b_local._8_8_;
      }
      else {
        a_04.high = a_01.high;
        a_04.low = b_local._8_8_;
        b_00.high = (uint16_t)b_local.low;
        b_00.low = uStack_38;
        a_04._10_6_ = 0;
        b_00._10_6_ = 0;
        fVar1 = propagateFloatx80NaN_tricore(a_04,b_00,_bExp);
        a_01.high = fVar1.high;
      }
      goto LAB_012c67df;
    }
    if (local_50 == 0) {
      local_7c = local_7c + -1;
    }
    shift64ExtraRightJamming(zSig0,0,local_7c,&zSig0,&stack0xffffffffffffff88);
    aSig._4_4_ = zExp;
LAB_012c6765:
    zSig1 = bSig + zSig0;
    if (-1 < (long)zSig1) {
LAB_012c677c:
      shift64ExtraRightJamming(zSig1,uStack_78,1,&zSig1,&stack0xffffffffffffff88);
      zSig1 = zSig1 | 0x8000000000000000;
      aSig._4_4_ = aSig._4_4_ + 1;
    }
  }
  fVar1 = roundAndPackFloatx80_tricore
                    (_bExp->floatx80_rounding_precision,status_local._7_1_,aSig._4_4_,zSig1,
                     uStack_78,_bExp);
  a_01.high = fVar1.high;
LAB_012c67df:
  a_local._8_8_ = fVar1.low;
  fVar2._10_6_ = fVar1._10_6_;
  fVar2.high = a_01.high;
  fVar2.low = a_local._8_8_;
  return fVar2;
}

Assistant:

static floatx80 addFloatx80Sigs(floatx80 a, floatx80 b, flag zSign,
                                float_status *status)
{
    int32_t aExp, bExp, zExp;
    uint64_t aSig, bSig, zSig0, zSig1;
    int32_t expDiff;

    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    bSig = extractFloatx80Frac( b );
    bExp = extractFloatx80Exp( b );
    expDiff = aExp - bExp;
    if ( 0 < expDiff ) {
        if ( aExp == 0x7FFF ) {
            if ((uint64_t)(aSig << 1)) {
                return propagateFloatx80NaN(a, b, status);
            }
            return a;
        }
        if ( bExp == 0 ) --expDiff;
        shift64ExtraRightJamming( bSig, 0, expDiff, &bSig, &zSig1 );
        zExp = aExp;
    }
    else if ( expDiff < 0 ) {
        if ( bExp == 0x7FFF ) {
            if ((uint64_t)(bSig << 1)) {
                return propagateFloatx80NaN(a, b, status);
            }
            return packFloatx80(zSign,
                                floatx80_infinity_high,
                                floatx80_infinity_low);
        }
        if ( aExp == 0 ) ++expDiff;
        shift64ExtraRightJamming( aSig, 0, - expDiff, &aSig, &zSig1 );
        zExp = bExp;
    }
    else {
        if ( aExp == 0x7FFF ) {
            if ( (uint64_t) ( ( aSig | bSig )<<1 ) ) {
                return propagateFloatx80NaN(a, b, status);
            }
            return a;
        }
        zSig1 = 0;
        zSig0 = aSig + bSig;
        if ( aExp == 0 ) {
            if (zSig0 == 0) {
                return packFloatx80(zSign, 0, 0);
            }
            normalizeFloatx80Subnormal( zSig0, &zExp, &zSig0 );
            goto roundAndPack;
        }
        zExp = aExp;
        goto shiftRight1;
    }
    zSig0 = aSig + bSig;
    if ( (int64_t) zSig0 < 0 ) goto roundAndPack;
 shiftRight1:
    shift64ExtraRightJamming( zSig0, zSig1, 1, &zSig0, &zSig1 );
    zSig0 |= UINT64_C(0x8000000000000000);
    ++zExp;
 roundAndPack:
    return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                zSign, zExp, zSig0, zSig1, status);
}